

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

ptr<Statement> __thiscall Parser::forStatement(Parser *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Parser *in_RSI;
  ptr<Statement> pVar1;
  undefined1 local_b0 [24];
  ptr<StatementBlock> statBlock;
  ptr<Expression> iterable;
  Token local_70;
  undefined1 local_38 [8];
  Identifier identifier;
  Parser *this_local;
  
  consume(in_RSI);
  token(&local_70,in_RSI);
  std::__cxx11::string::string((string *)local_38,(string *)&local_70.lexeme);
  Token::~Token(&local_70);
  consume(in_RSI,Identifier,"identifier");
  consume(in_RSI,In,"\'in\'");
  expression((Parser *)
             &statBlock.super___shared_ptr<StatementBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  in_RSI->functionCounter = in_RSI->functionCounter + 1;
  statementBlock((Parser *)(local_b0 + 0x10));
  in_RSI->functionCounter = in_RSI->functionCounter + -1;
  make<ForStatement,std::__cxx11::string&,std::shared_ptr<Expression>&,std::shared_ptr<StatementBlock>&>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0,
             (shared_ptr<Expression> *)local_38,
             (shared_ptr<StatementBlock> *)
             &statBlock.super___shared_ptr<StatementBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::shared_ptr<Statement>::shared_ptr<ForStatement,void>
            ((shared_ptr<Statement> *)this,(shared_ptr<ForStatement> *)local_b0);
  std::shared_ptr<ForStatement>::~shared_ptr((shared_ptr<ForStatement> *)local_b0);
  std::shared_ptr<StatementBlock>::~shared_ptr((shared_ptr<StatementBlock> *)(local_b0 + 0x10));
  std::shared_ptr<Expression>::~shared_ptr
            ((shared_ptr<Expression> *)
             &statBlock.super___shared_ptr<StatementBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__cxx11::string::~string((string *)local_38);
  pVar1.super___shared_ptr<Statement,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  pVar1.super___shared_ptr<Statement,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (ptr<Statement>)pVar1.super___shared_ptr<Statement,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<Statement> Parser::forStatement() {
    consume();
    Identifier identifier = token().lexeme;
    consume(TokenType::Identifier, "identifier");

    consume(TokenType::In, "'in'");

    ptr<Expression> iterable = expression();

    functionCounter++;
    ptr<StatementBlock> statBlock = statementBlock();
    functionCounter--;

    return make<ForStatement>(identifier, iterable, statBlock);
}